

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O0

void __thiscall spdlog::async_logger::sink_it_(async_logger *this,log_msg *msg)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  exception *ex;
  shared_ptr<spdlog::details::thread_pool> pool_ptr;
  int unused;
  string_view sv;
  enable_shared_from_this<spdlog::async_logger> *in_stack_fffffffffffffdb8;
  weak_ptr<spdlog::details::thread_pool> *in_stack_fffffffffffffdc8;
  allocator<char> *__a;
  char *in_stack_fffffffffffffdf8;
  allocator<char> local_159 [65];
  __shared_ptr local_118 [132];
  async_overflow_policy in_stack_ffffffffffffff6c;
  log_msg *in_stack_ffffffffffffff70;
  async_logger_ptr *in_stack_ffffffffffffff78;
  thread_pool *in_stack_ffffffffffffff80;
  
  std::weak_ptr<spdlog::details::thread_pool>::lock(in_stack_fffffffffffffdc8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_118);
  if (!bVar1) {
    __a = local_159;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,in_stack_fffffffffffffdf8,__a);
    throw_spdlog_ex(in_RDI);
  }
  std::__shared_ptr_access<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x15804b);
  std::enable_shared_from_this<spdlog::async_logger>::shared_from_this(in_stack_fffffffffffffdb8);
  details::thread_pool::post_log
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff6c);
  std::shared_ptr<spdlog::async_logger>::~shared_ptr((shared_ptr<spdlog::async_logger> *)0x15809f);
  std::shared_ptr<spdlog::details::thread_pool>::~shared_ptr
            ((shared_ptr<spdlog::details::thread_pool> *)0x158172);
  return;
}

Assistant:

SPDLOG_INLINE void spdlog::async_logger::sink_it_(const details::log_msg &msg){
    SPDLOG_TRY{if (auto pool_ptr = thread_pool_.lock()){
        pool_ptr->post_log(shared_from_this(), msg, overflow_policy_);
}
else {
    throw_spdlog_ex("async log: thread pool doesn't exist anymore");
}
}
SPDLOG_LOGGER_CATCH(msg.source)
}